

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

err_t CallCreate(nodecontext *p,node *Node,nodeclass *Class)

{
  err_t eVar1;
  long lVar2;
  array *Ptr;
  nodemeta *i;
  nodeclass *Class_local;
  node *Node_local;
  nodecontext *p_local;
  
  if (Class != (nodeclass *)0x0) {
    if ((Class->ParentId != 0) && (Class->ParentClass == (nodeclass *)0x0)) {
      return -5;
    }
    eVar1 = CallCreate(p,Node,Class->ParentClass);
    if (eVar1 != 0) {
      return -5;
    }
    if ((Class->Meta == (nodemeta *)0x0) || (Class->State < '\x01')) {
      __assert_fail("Class->Meta && Class->State>=CLASS_INITED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x318,"err_t CallCreate(nodecontext *, node *, const nodeclass *)");
    }
    for (Ptr = (array *)Class->Meta; ((ulong)Ptr->_Begin & 0xff) != 0; Ptr = Ptr + 1) {
      if (((ulong)Ptr->_Begin & 0xc0) == 0x80) {
        MetaConst((nodemeta *)Ptr,Node);
      }
      else if ((((ulong)Ptr->_Begin & 0xff) == 0x5e) && (-1 < (long)Ptr->_Used)) {
        ArrayInitEx((array *)((long)&Node->FourCC + Ptr->_Used),p->NodeHeap);
      }
      else if ((((ulong)Ptr->_Begin & 0xff) == 0xd) &&
              (lVar2 = (*(code *)Ptr->_Used)(Node), lVar2 != 0)) {
        CallDelete(p,Node,Class->ParentClass);
        return -5;
      }
    }
  }
  return 0;
}

Assistant:

static err_t CallCreate(nodecontext* p,node* Node,const nodeclass* Class)
{
    if (Class)
    {
        const nodemeta* i;

        if (Class->ParentId && !Class->ParentClass)
            return ERR_NOT_SUPPORTED;

        if (CallCreate(p,Node,Class->ParentClass)!=ERR_NONE)
            return ERR_NOT_SUPPORTED;

        assert(Class->Meta && Class->State>=CLASS_INITED);

        for (i=Class->Meta;i->Meta != META_CLASS_PARENT_ID;++i)
        {
            if ((i->Meta & META_MODE_MASK)==META_MODE_CONST)
                MetaConst(i,Node);
            else
            if (i->Meta == (META_MODE_DATA | TYPE_ARRAY) && (intptr_t)i->Data>=0)
            {
                array* Ptr = (void*)((uint8_t*)Node+i->Data);
                ArrayInitEx(Ptr,p->NodeHeap);
            }
            else
            if (i->Meta == META_CLASS_CREATE && ((err_t(*)(node*))i->Data)(Node) != ERR_NONE)
            {
                CallDelete(p,Node,Class->ParentClass);
                return ERR_NOT_SUPPORTED;
            }
        }
    }
    return ERR_NONE;
}